

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
::ApproximateSubinterval
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
           *this)

{
  PLApproxParams *pPVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double y;
  double dx0;
  double local_30;
  double local_28;
  double local_20;
  
  local_30 = (this->laPrm_->plPoints).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish[-1];
  local_28 = (this->laPrm_->plPoints).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish[-1];
  do {
    (*this->_vptr_BasicPLApproximator[0x18])(local_30,this);
    local_20 = extraout_XMM0_Qa;
    (*this->_vptr_BasicPLApproximator[0x19])(local_30,local_28,this,&local_20);
    (*this->_vptr_BasicPLApproximator[0x1a])(local_30,local_28,this,&local_20);
    local_30 = local_30 + local_20;
    dVar2 = ub_sub(this);
    if (dVar2 - local_30 < 1e-06) {
      local_30 = ub_sub(this);
    }
    pPVar1 = this->laPrm_;
    (*this->_vptr_BasicPLApproximator[9])(local_30,this);
    PLPoints::AddPoint(&pPVar1->plPoints,local_30,y);
    dVar2 = ub_sub(this);
    local_28 = y;
  } while (local_30 < dVar2);
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::ApproximateSubinterval() {
  assert(GetPL().size());
  auto x0 = GetPL().x_.back();
  auto f0 = GetPL().y_.back();    // can be != f(x0)
  /// Simple: breakpoints on the function
  do {
    auto dx0 = ComputeInitialStepLength(x0);
    assert(x0+dx0 <= ub_sub());
    IncreaseStepWhileErrorSmallEnough(x0, f0, dx0);
    DecreaseStepWhileErrorTooBig(x0, f0, dx0);
    x0 += dx0;
    if (ub_sub()-x0 < 1e-6)        // constant param
      x0 = ub_sub();
    GetPL().AddPoint(x0, f0 = eval(x0));
  } while (x0 < ub_sub());
}